

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void __thiscall RandStrAtom::RandStrAtom(RandStrAtom *this,RandStrParser *p)

{
  RandStrNode **ppRVar1;
  size_t sVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  RandStrNode *pRVar6;
  RandStrNode *pRVar7;
  int iVar8;
  wchar_t wVar9;
  RandStrNode **ppRVar10;
  
  ppRVar1 = &(this->super_RandStrNode).firstChild;
  (this->super_RandStrNode).firstChild = (RandStrNode *)0x0;
  (this->super_RandStrNode).lastChild = (RandStrNode *)0x0;
  (this->super_RandStrNode).nextSibling = (RandStrNode *)0x0;
  this->ch = L'\0';
  this->isLit = 0;
  (this->super_RandStrNode)._vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_00325240;
  this->listChars = 0;
  if ((p->rem == 0) || (wVar3 = utf8_ptr::s_getch((p->p).p_), wVar3 != L'[')) {
    if ((p->rem == 0) || (wVar3 = utf8_ptr::s_getch((p->p).p_), wVar3 != L'%')) {
      if (p->rem == 0) {
        wVar3 = L'\0';
      }
      else {
        wVar3 = utf8_ptr::s_getch((p->p).p_);
      }
      this->ch = wVar3;
    }
    else {
      RandStrParser::skip(p);
      if (p->rem == 0) {
        wVar3 = L'%';
      }
      else {
        wVar3 = utf8_ptr::s_getch((p->p).p_);
      }
      this->ch = wVar3;
      this->isLit = 1;
    }
  }
  else {
    RandStrParser::skip(p);
    sVar2 = p->rem;
    while ((sVar2 != 0 && (wVar3 = utf8_ptr::s_getch((p->p).p_), wVar3 != L']'))) {
      if (p->rem == 0) {
        wVar3 = L'\0';
      }
      else {
        wVar3 = utf8_ptr::s_getch((p->p).p_);
      }
      if (wVar3 == L'%') {
        RandStrParser::skip(p);
        if (p->rem == 0) {
          wVar3 = L'%';
        }
        else {
          wVar3 = utf8_ptr::s_getch((p->p).p_);
        }
      }
      RandStrParser::skip(p);
      if ((p->rem == 0) || (wVar4 = utf8_ptr::s_getch((p->p).p_), wVar4 != L'-')) {
        pRVar7 = (RandStrNode *)operator_new(0x28);
        pRVar7->firstChild = (RandStrNode *)0x0;
        pRVar7->lastChild = (RandStrNode *)0x0;
        pRVar7->nextSibling = (RandStrNode *)0x0;
        pRVar7->_vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_00325288;
        *(wchar_t *)&pRVar7[1]._vptr_RandStrNode = wVar3;
        *(wchar_t *)((long)&pRVar7[1]._vptr_RandStrNode + 4) = wVar3;
        pRVar6 = (this->super_RandStrNode).lastChild;
        ppRVar10 = &pRVar6->nextSibling;
        if (pRVar6 == (RandStrNode *)0x0) {
          ppRVar10 = ppRVar1;
        }
        *ppRVar10 = pRVar7;
        (this->super_RandStrNode).lastChild = pRVar7;
        iVar5 = this->listChars;
      }
      else {
        RandStrParser::skip(p);
        if ((p->rem != 0) && (wVar4 = utf8_ptr::s_getch((p->p).p_), wVar4 == L'%')) {
          RandStrParser::skip(p);
        }
        wVar4 = wVar3;
        if (p->rem != 0) {
          wVar4 = utf8_ptr::s_getch((p->p).p_);
        }
        RandStrParser::skip(p);
        pRVar6 = (RandStrNode *)operator_new(0x28);
        pRVar6->firstChild = (RandStrNode *)0x0;
        pRVar6->lastChild = (RandStrNode *)0x0;
        pRVar6->nextSibling = (RandStrNode *)0x0;
        iVar8 = wVar4 - wVar3;
        wVar9 = wVar3;
        if (wVar4 < wVar3) {
          wVar9 = wVar4;
        }
        if (iVar8 != 0 && wVar3 <= wVar4) {
          wVar3 = wVar4;
        }
        pRVar6->_vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_00325288;
        *(wchar_t *)&pRVar6[1]._vptr_RandStrNode = wVar9;
        *(wchar_t *)((long)&pRVar6[1]._vptr_RandStrNode + 4) = wVar3;
        pRVar7 = (this->super_RandStrNode).lastChild;
        ppRVar10 = &pRVar7->nextSibling;
        if (pRVar7 == (RandStrNode *)0x0) {
          ppRVar10 = ppRVar1;
        }
        *ppRVar10 = pRVar6;
        (this->super_RandStrNode).lastChild = pRVar6;
        iVar5 = -iVar8;
        if (0 < iVar8) {
          iVar5 = iVar8;
        }
        iVar5 = iVar5 + this->listChars;
      }
      this->listChars = iVar5 + 1;
      sVar2 = p->rem;
    }
  }
  RandStrParser::skip(p);
  return;
}

Assistant:

RandStrAtom(class RandStrParser *p)
    {
        /* we don't have a character class or literal character yet */
        ch = 0;
        isLit = FALSE;
        
        /* we have no character list items yet */
        listChars = 0;
        
        /* check for a character list of the form [abcw-z] */
        if (p->getch() == '[')
        {
            /* keep going until we reach the ']' or end of string */
            for (p->skip() ; p->more() && p->getch() != ']' ; )
            {
                /* get the next character */
                wchar_t c1 = p->getch();

                /* check for quoting */
                if (c1 == '%')
                {
                    /* skip the '%' and get the quoted character */
                    p->skip();
                    c1 = (p->more() ? p->getch() : '%');
                }

                /* skip the character */
                p->skip();

                /* if the next character is '-', we have a range expression */
                if (p->getch() == '-')
                {
                    /* skip the '-' */
                    p->skip();

                    /* if there's a '%', skip it as well */
                    if (p->getch() == '%')
                        p->skip();

                    /* get the upper bound character */
                    wchar_t c2 = (p->more() ? p->getch() : c1);

                    /* skip the second character */
                    p->skip();

                    /* add the range */
                    addChild(new RandStrRange(c1, c2));
                    listChars += (c2 > c1 ? c2 - c1 : c1 - c2) + 1;
                }
                else
                {
                    /* it's just this character in the range */
                    addChild(new RandStrRange(c1, c1));
                    listChars += 1;
                }
            }

            /* skip the ']' */
            p->skip();
        }
        else if (p->getch() == '%')
        {
            /* 
             *   quoted character expression - skip the '%' and store the
             *   single character 
             */
            p->skip();
            ch = p->more() ? p->getch() : '%';

            /* note that this is a literal character expression */
            isLit = TRUE;

            /* skip the character */
            p->skip();
        }
        else
        {
            /* character class expression - store it and skip it */
            ch = p->getch();
            p->skip();
        }
    }